

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void Acb_NtkFindSupp_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vSupp)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((-1 < iObj) && (iObj < (p->vObjTrav).nSize)) {
    piVar3 = (p->vObjTrav).pArray;
    iVar1 = p->nObjTravs;
    iVar2 = piVar3[(uint)iObj];
    piVar3[(uint)iObj] = iVar1;
    if (iVar2 == iVar1) {
      return;
    }
    if (iObj == 0) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
    }
    if ((p->vObjType).nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    iVar1 = (p->vObjFans).nSize;
    if ((p->vObjType).pArray[(uint)iObj] == '\x03') {
      if (iVar1 <= iObj) goto LAB_0036d29a;
      iVar1 = (p->vObjFans).pArray[(uint)iObj];
      if ((-1 < (long)iVar1) && (iVar1 < (p->vFanSto).nSize)) {
        Vec_IntPush(vSupp,(p->vFanSto).pArray[(long)iVar1 + 2]);
        return;
      }
    }
    else {
      if (iVar1 <= iObj) goto LAB_0036d29a;
      iVar1 = (p->vObjFans).pArray[(uint)iObj];
      lVar6 = (long)iVar1;
      if ((-1 < lVar6) && (iVar1 < (p->vFanSto).nSize)) {
        piVar3 = (p->vFanSto).pArray;
        if (piVar3[lVar6] < 1) {
          return;
        }
        lVar5 = 0;
        do {
          lVar4 = lVar5 + 1;
          lVar5 = lVar5 + 1;
          Acb_NtkFindSupp_rec(p,piVar3[lVar6 + lVar4],vSupp);
        } while (lVar5 < piVar3[lVar6]);
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_0036d29a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkFindSupp_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vSupp )
{
    int * pFanin, iFanin, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Acb_ObjIsCi(p, iObj) )
        Vec_IntPush( vSupp, Acb_ObjCioId(p, iObj) );
    else
        Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
            Acb_NtkFindSupp_rec( p, iFanin, vSupp );
}